

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O1

void SUNLinSolFreeEmpty(SUNLinearSolver S)

{
  if (S != (SUNLinearSolver)0x0) {
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
    }
    S->ops = (SUNLinearSolver_Ops)0x0;
    free(S);
    return;
  }
  return;
}

Assistant:

void SUNLinSolFreeEmpty(SUNLinearSolver S)
{
  if (S == NULL) { return; }

  /* free non-NULL ops structure */
  if (S->ops) { free(S->ops); }
  S->ops = NULL;

  /* free overall N_Vector object and return */
  free(S);
  return;
}